

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int cs_impl::fiber::resume(routine_t id)

{
  long lVar1;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *this;
  reference ppRVar2;
  char *pcVar3;
  element_type *peVar4;
  int in_EDI;
  Routine *routine;
  value_type this_00;
  int local_4;
  
  lVar1 = ordinator();
  if (*(int *)(lVar1 + 0x30) == 0) {
    this = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
           ordinator();
    ppRVar2 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
              operator[](this,(ulong)(in_EDI - 1));
    this_00 = *ppRVar2;
    if (this_00 == (value_type)0x0) {
      local_4 = -1;
    }
    else if ((this_00->finished & 1U) == 0) {
      if (this_00->stack == (char *)0x0) {
        getcontext(&this_00->ctx);
        lVar1 = ordinator();
        pcVar3 = (char *)operator_new__(*(ulong *)(lVar1 + 0x38));
        this_00->stack = pcVar3;
        (this_00->ctx).uc_stack.ss_sp = this_00->stack;
        lVar1 = ordinator();
        (this_00->ctx).uc_stack.ss_size = *(size_t *)(lVar1 + 0x38);
        lVar1 = ordinator();
        (this_00->ctx).uc_link = (ucontext_t *)(lVar1 + 0x40);
        lVar1 = ordinator();
        *(int *)(lVar1 + 0x30) = in_EDI;
        makecontext(&this_00->ctx,entry,0);
        cs::current_process =
             &(std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::get
                         ((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>
                           *)this_00)->is_sigint_raised)._M_base._M_i;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x527bbe);
        peVar4 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x527bca);
        cs::instance_type::swap_context(peVar4,&this_00->cs_stack);
        lVar1 = ordinator();
        swapcontext(lVar1 + 0x40,&this_00->ctx);
      }
      else {
        lVar1 = ordinator();
        *(int *)(lVar1 + 0x30) = in_EDI;
        cs::current_process =
             &(std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::get
                         ((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>
                           *)this_00)->is_sigint_raised)._M_base._M_i;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x527c32);
        peVar4 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x527c3e);
        cs::instance_type::swap_context(peVar4,&this_00->cs_stack);
        lVar1 = ordinator();
        swapcontext(lVar1 + 0x40,&this_00->ctx);
      }
      local_4 = 0;
    }
    else {
      local_4 = -2;
    }
    return local_4;
  }
  __assert_fail("ordinator.current == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x157,"int cs_impl::fiber::resume(routine_t)");
}

Assistant:

int resume(routine_t id)
		{
			assert(ordinator.current == 0);

			Routine *routine = ordinator.routines[id - 1];
			if (routine == nullptr)
				return -1;

			if (routine->finished)
				return -2;

			if (routine->stack == nullptr) {
				//initializes the structure to the currently active context.
				//When successful, getcontext() returns 0
				//On error, return -1 and set errno appropriately.
				cs_fiber_getcontext(&routine->ctx);

				//Before invoking makecontext(), the caller must allocate a new stack
				//for this context and assign its address to ucp->uc_stack,
				//and define a successor context and assign its address to ucp->uc_link.
				routine->stack = new char[ordinator.stack_size];
				routine->ctx.uc_stack.ss_sp = routine->stack;
				routine->ctx.uc_stack.ss_size = ordinator.stack_size;
				routine->ctx.uc_link = &ordinator.ctx;
				ordinator.current = id;

				//When this context is later activated by swapcontext(), the function entry is called.
				//When this function returns, the  successor context is activated.
				//If the successor context pointer is NULL, the thread exits.
				cs_fiber_makecontext(&routine->ctx, reinterpret_cast<void (*)(void)>(entry), 0);

				//The swapcontext() function saves the current context,
				//and then activates the context of another.
				cs::current_process = routine->cs_pcontext.get();
				routine->cs_context->instance->swap_context(&routine->cs_stack);
				cs_fiber_swapcontext(&ordinator.ctx, &routine->ctx);
			}
			else {
				ordinator.current = id;
				cs::current_process = routine->cs_pcontext.get();
				routine->cs_context->instance->swap_context(&routine->cs_stack);
				cs_fiber_swapcontext(&ordinator.ctx, &routine->ctx);
			}

			return 0;
		}